

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFLTKWrapUICommand.cxx
# Opt level: O0

void __thiscall cmFLTKWrapUICommand::FinalPass(cmFLTKWrapUICommand *this)

{
  string *psVar1;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string msg;
  cmTarget *target;
  cmFLTKWrapUICommand *this_local;
  
  msg.field_2._8_8_ =
       cmMakefile::FindLocalNonAliasTarget((this->super_cmCommand).Makefile,&this->Target);
  if ((cmTarget *)msg.field_2._8_8_ == (cmTarget *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_38,"FLTK_WRAP_UI was called with a target that was never created: ",
               &local_39);
    std::allocator<char>::~allocator(&local_39);
    std::__cxx11::string::operator+=((string *)local_38,(string *)&this->Target);
    std::__cxx11::string::operator+=
              ((string *)local_38,".  The problem was found while processing the source directory: "
              );
    psVar1 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    std::__cxx11::string::operator+=((string *)local_38,(string *)psVar1);
    std::__cxx11::string::operator+=
              ((string *)local_38,".  This FLTK_WRAP_UI call will be ignored.");
    cmSystemTools::Message((string *)local_38,"Warning");
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void cmFLTKWrapUICommand::FinalPass()
{
  // people should add the srcs to the target themselves, but the old command
  // didn't support that, so check and see if they added the files in and if
  // they didn;t then print a warning and add then anyhow
  cmTarget* target = this->Makefile->FindLocalNonAliasTarget(this->Target);
  if (!target) {
    std::string msg =
      "FLTK_WRAP_UI was called with a target that was never created: ";
    msg += this->Target;
    msg += ".  The problem was found while processing the source directory: ";
    msg += this->Makefile->GetCurrentSourceDirectory();
    msg += ".  This FLTK_WRAP_UI call will be ignored.";
    cmSystemTools::Message(msg, "Warning");
    return;
  }
}